

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_test.cpp
# Opt level: O2

void test_files(shared_ptr<cppcms::sessions::session_storage> *storage,session_storage_factory *f)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  string tstr;
  allocator local_1e1;
  allocator local_1e0 [32];
  time_t ttime;
  __shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  ostringstream oss;
  
  std::__shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,
             &storage->
              super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>);
  test((shared_ptr<cppcms::sessions::session_storage> *)&local_1b8,f);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
  iVar3 = (*f->_vptr_session_storage_factory[1])();
  if ((char)iVar3 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,99);
    std::operator<<(poVar5," f.requires_gc()");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tstr);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar4 = time((time_t *)0x0);
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &bs_abi_cxx11_,"1");
  std::__cxx11::string::string((string *)&tstr,"test",local_1e0);
  (**peVar1->_vptr_session_storage)(peVar1,&oss,tVar4,&tstr);
  std::__cxx11::string::~string((string *)&tstr);
  std::__cxx11::string::~string((string *)&oss);
  iVar3 = count_files();
  if (iVar3 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x66);
    std::operator<<(poVar5," count_files()==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tstr);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &bs_abi_cxx11_,"1");
  (*peVar1->_vptr_session_storage[2])
            (peVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  iVar3 = count_files();
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x68);
    std::operator<<(poVar5," count_files()==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tstr);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &bs_abi_cxx11_,"1");
  std::__cxx11::string::string((string *)&tstr,"test",local_1e0);
  (**peVar1->_vptr_session_storage)(peVar1,&oss,tVar4 + -1,&tstr);
  std::__cxx11::string::~string((string *)&tstr);
  std::__cxx11::string::~string((string *)&oss);
  peVar1 = (storage->
           super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &bs_abi_cxx11_,"2");
  std::__cxx11::string::string((string *)&tstr,"test2",local_1e0);
  (**peVar1->_vptr_session_storage)(peVar1,&oss,tVar4 + 1,&tstr);
  std::__cxx11::string::~string((string *)&tstr);
  std::__cxx11::string::~string((string *)&oss);
  iVar3 = count_files();
  if (iVar3 == 2) {
    (*f->_vptr_session_storage_factory[2])(f);
    iVar3 = count_files();
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x6d);
      std::operator<<(poVar5," count_files()==1");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&tstr);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tstr._M_dataplus._M_p = (pointer)&tstr.field_2;
    tstr._M_string_length = 0;
    tstr.field_2._M_local_buf[0] = '\0';
    peVar1 = (storage->
             super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   &bs_abi_cxx11_,"1");
    iVar3 = (*peVar1->_vptr_session_storage[1])(peVar1,&oss,&ttime,&tstr);
    std::__cxx11::string::~string((string *)&oss);
    if ((char)iVar3 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x70);
      std::operator<<(poVar5," !storage->load(bs+\"1\",ttime,tstr)");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar1 = (storage->
             super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   &bs_abi_cxx11_,"2");
    iVar3 = (*peVar1->_vptr_session_storage[1])(peVar1,&oss,&ttime,&tstr);
    std::__cxx11::string::~string((string *)&oss);
    if ((char)iVar3 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar5 = std::operator<<((ostream *)&oss,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x71);
      std::operator<<(poVar5," storage->load(bs+\"2\",ttime,tstr)");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (ttime == tVar4 + 1) {
      bVar2 = std::operator==(&tstr,"test2");
      if (bVar2) {
        peVar1 = (storage->
                 super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                       &bs_abi_cxx11_,"2");
        std::__cxx11::string::string((string *)local_1e0,"test2",&local_1e1);
        (**peVar1->_vptr_session_storage)(peVar1,&oss,tVar4 + -1,local_1e0);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::string::~string((string *)&oss);
        iVar3 = count_files();
        if (iVar3 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar5 = std::operator<<((ostream *)&oss,"Error ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x74);
          std::operator<<(poVar5," count_files()==1");
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (*f->_vptr_session_storage_factory[2])(f);
        iVar3 = count_files();
        if (iVar3 == 0) {
          std::__cxx11::string::~string((string *)&tstr);
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar5 = std::operator<<((ostream *)&oss,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x76);
        std::operator<<(poVar5," count_files()==0");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar5 = std::operator<<((ostream *)&oss,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x72);
    std::operator<<(poVar5," ttime==now+1 && tstr==\"test2\"");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar5 = std::operator<<((ostream *)&oss,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x6b);
  std::operator<<(poVar5," count_files()==2");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&tstr);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_files(booster::shared_ptr<cppcms::sessions::session_storage> storage,
		cppcms::sessions::session_storage_factory &f)
{
	test(storage,f);
	TEST(f.requires_gc());
	time_t now=time(0);
	storage->save(bs+"1",now,"test");
	TEST(count_files()==1);
	storage->remove(bs+"1");
	TEST(count_files()==0);
	storage->save(bs+"1",now-1,"test");
	storage->save(bs+"2",now+1,"test2");
	TEST(count_files()==2);
	f.gc_job();
	TEST(count_files()==1);
	std::string tstr;
	time_t ttime;
	TEST(!storage->load(bs+"1",ttime,tstr));
	TEST(storage->load(bs+"2",ttime,tstr));
	TEST(ttime==now+1 && tstr=="test2");
	storage->save(bs+"2",now-1,"test2");
	TEST(count_files()==1);
	f.gc_job();
	TEST(count_files()==0);
}